

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O2

int __thiscall
soplex::SPxDevexPR<double>::selectLeaveX(SPxDevexPR<double> *this,double feastol,int start,int incr)

{
  double dVar1;
  double dVar2;
  SPxSolverBase<double> *pSVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  ulong uVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  
  pSVar3 = (this->super_SPxPricer<double>).thesolver;
  pdVar4 = (pSVar3->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (pSVar3->coWeights).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar6 = (pSVar3->coWeights).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar7 = 0xffffffffffffffff;
  dVar9 = 0.0;
  for (uVar8 = (ulong)start; (long)uVar8 < (long)(int)((ulong)((long)pdVar6 - (long)pdVar5) >> 3);
      uVar8 = uVar8 + (long)incr) {
    dVar1 = pdVar4[uVar8];
    if (dVar1 < -feastol) {
      dVar2 = pdVar5[uVar8];
      dVar10 = feastol;
      if (feastol <= dVar2) {
        dVar10 = dVar2;
      }
      dVar10 = (dVar1 * dVar1) / dVar10;
      if (dVar9 < dVar10) {
        this->last = dVar2;
        uVar7 = uVar8 & 0xffffffff;
        dVar9 = dVar10;
      }
    }
  }
  return (int)uVar7;
}

Assistant:

int SPxDevexPR<R>::selectLeaveX(R feastol, int start, int incr)
{
   R x;

   const R* fTest = this->thesolver->fTest().get_const_ptr();
   const R* cpen = this->thesolver->coWeights.get_const_ptr();
   R best = 0;
   int bstI = -1;
   int end = this->thesolver->coWeights.dim();

   for(; start < end; start += incr)
   {
      if(fTest[start] < -feastol)
      {
         x = devexpr::computePrice(fTest[start], cpen[start], feastol);

         if(x > best)
         {
            best = x;
            bstI = start;
            last = cpen[start];
         }
      }
   }

   return bstI;
}